

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferVkImpl.cpp
# Opt level: O0

SparseBufferProperties __thiscall Diligent::BufferVkImpl::GetSparseProperties(BufferVkImpl *this)

{
  uint uVar1;
  Char *Message;
  VulkanLogicalDevice *this_00;
  VkBuffer vkBuffer;
  SparseBufferProperties SVar2;
  undefined1 local_68 [8];
  VkMemoryRequirements MemReq;
  undefined1 local_40 [8];
  string msg;
  BufferVkImpl *this_local;
  SparseBufferProperties Props;
  
  msg.field_2._8_8_ = this;
  if ((this->super_BufferBase<Diligent::EngineVkImplTraits>).
      super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
      .m_Desc.Usage != USAGE_SPARSE) {
    FormatString<char[62]>
              ((string *)local_40,
               (char (*) [62])"IBuffer::GetSparseProperties() must be used for sparse buffer");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetSparseProperties",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
               ,0x267);
    std::__cxx11::string::~string((string *)local_40);
  }
  this_00 = RenderDeviceVkImpl::GetLogicalDevice
                      ((this->super_BufferBase<Diligent::EngineVkImplTraits>).
                       super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                       .m_pDevice);
  vkBuffer = GetVkBuffer(this);
  VulkanUtilities::VulkanLogicalDevice::GetBufferMemoryRequirements
            ((VkMemoryRequirements *)local_68,this_00,vkBuffer);
  uVar1 = StaticCast<unsigned_int,unsigned_long>(&MemReq.size);
  SVar2.BlockSize = uVar1;
  SVar2.AddressSpaceSize = (Uint64)local_68;
  SVar2._12_4_ = 0;
  return SVar2;
}

Assistant:

SparseBufferProperties BufferVkImpl::GetSparseProperties() const
{
    DEV_CHECK_ERR(m_Desc.Usage == USAGE_SPARSE,
                  "IBuffer::GetSparseProperties() must be used for sparse buffer");

    VkMemoryRequirements MemReq = m_pDevice->GetLogicalDevice().GetBufferMemoryRequirements(GetVkBuffer());

    SparseBufferProperties Props{};
    Props.AddressSpaceSize = MemReq.size;
    Props.BlockSize        = StaticCast<Uint32>(MemReq.alignment);
    return Props;
}